

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SHA1.cpp
# Opt level: O2

void __thiscall CSHA1::Transform(CSHA1 *this,uint *state,uchar *buffer)

{
  SHA1_WORKSPACE_BLOCK *pSVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  
  uVar16 = *state;
  uVar12 = state[1];
  uVar9 = state[2];
  uVar15 = state[3];
  pSVar1 = this->m_block;
  uVar2 = *(undefined8 *)buffer;
  uVar3 = *(undefined8 *)(buffer + 8);
  uVar4 = *(undefined8 *)(buffer + 0x10);
  uVar5 = *(undefined8 *)(buffer + 0x18);
  uVar6 = *(undefined8 *)(buffer + 0x20);
  uVar7 = *(undefined8 *)(buffer + 0x28);
  uVar8 = *(undefined8 *)(buffer + 0x38);
  uVar13 = state[4];
  *(undefined8 *)(pSVar1->c + 0x30) = *(undefined8 *)(buffer + 0x30);
  *(undefined8 *)(pSVar1->c + 0x38) = uVar8;
  *(undefined8 *)(pSVar1->c + 0x20) = uVar6;
  *(undefined8 *)(pSVar1->c + 0x28) = uVar7;
  *(undefined8 *)(pSVar1->c + 0x10) = uVar4;
  *(undefined8 *)(pSVar1->c + 0x18) = uVar5;
  *(undefined8 *)pSVar1 = uVar2;
  *(undefined8 *)(pSVar1->c + 8) = uVar3;
  uVar17 = this->m_block->l[0];
  uVar17 = uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 | uVar17 << 0x18;
  this->m_block->l[0] = uVar17;
  uVar18 = uVar17 + 0x5a827999 +
           ((uVar15 ^ uVar9) & uVar12 ^ uVar15) + (uVar16 << 5 | uVar16 >> 0x1b) + uVar13;
  uVar13 = uVar12 << 0x1e | uVar12 >> 2;
  uVar12 = this->m_block->l[1];
  uVar12 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
  this->m_block->l[1] = uVar12;
  uVar12 = ((uVar13 ^ uVar9) & uVar16 ^ uVar9) + uVar15 + uVar12 + 0x5a827999 +
           (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar15 = uVar16 << 0x1e | uVar16 >> 2;
  uVar16 = this->m_block->l[2];
  uVar16 = uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 | uVar16 << 0x18;
  this->m_block->l[2] = uVar16;
  uVar17 = uVar16 + uVar9 + ((uVar13 ^ uVar15) & uVar18 ^ uVar13) + 0x5a827999 +
           (uVar12 * 0x20 | uVar12 >> 0x1b);
  uVar19 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar16 = this->m_block->l[3];
  uVar16 = uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 | uVar16 << 0x18;
  this->m_block->l[3] = uVar16;
  uVar9 = uVar12 * 0x40000000 | uVar12 >> 2;
  uVar12 = uVar16 + uVar13 + ((uVar19 ^ uVar15) & uVar12 ^ uVar15) + 0x5a827999 +
           (uVar17 * 0x20 | uVar17 >> 0x1b);
  uVar16 = this->m_block->l[4];
  uVar16 = uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 | uVar16 << 0x18;
  this->m_block->l[4] = uVar16;
  uVar13 = uVar16 + uVar15 + ((uVar9 ^ uVar19) & uVar17 ^ uVar19) + 0x5a827999 +
           (uVar12 * 0x20 | uVar12 >> 0x1b);
  uVar18 = uVar17 * 0x40000000 | uVar17 >> 2;
  uVar16 = this->m_block->l[5];
  uVar16 = uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 | uVar16 << 0x18;
  this->m_block->l[5] = uVar16;
  uVar17 = uVar16 + uVar19 + ((uVar18 ^ uVar9) & uVar12 ^ uVar9) + 0x5a827999 +
           (uVar13 * 0x20 | uVar13 >> 0x1b);
  uVar15 = uVar12 * 0x40000000 | uVar12 >> 2;
  uVar16 = this->m_block->l[6];
  uVar16 = uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 | uVar16 << 0x18;
  this->m_block->l[6] = uVar16;
  uVar19 = uVar16 + uVar9 + ((uVar15 ^ uVar18) & uVar13 ^ uVar18) + 0x5a827999 +
           (uVar17 * 0x20 | uVar17 >> 0x1b);
  uVar9 = uVar13 * 0x40000000 | uVar13 >> 2;
  uVar16 = this->m_block->l[7];
  uVar16 = uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 | uVar16 << 0x18;
  this->m_block->l[7] = uVar16;
  uVar13 = uVar17 * 0x40000000 | uVar17 >> 2;
  uVar12 = uVar16 + uVar18 + ((uVar9 ^ uVar15) & uVar17 ^ uVar15) + 0x5a827999 +
           (uVar19 * 0x20 | uVar19 >> 0x1b);
  uVar16 = this->m_block->l[8];
  uVar16 = uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 | uVar16 << 0x18;
  this->m_block->l[8] = uVar16;
  uVar15 = uVar16 + uVar15 + ((uVar13 ^ uVar9) & uVar19 ^ uVar9) + 0x5a827999 +
           (uVar12 * 0x20 | uVar12 >> 0x1b);
  uVar17 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar16 = this->m_block->l[9];
  uVar16 = uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 | uVar16 << 0x18;
  this->m_block->l[9] = uVar16;
  uVar9 = uVar16 + uVar9 + ((uVar17 ^ uVar13) & uVar12 ^ uVar13) + 0x5a827999 +
          (uVar15 * 0x20 | uVar15 >> 0x1b);
  uVar12 = uVar12 * 0x40000000 | uVar12 >> 2;
  uVar16 = this->m_block->l[10];
  uVar16 = uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 | uVar16 << 0x18;
  this->m_block->l[10] = uVar16;
  uVar13 = uVar16 + uVar13 + ((uVar12 ^ uVar17) & uVar15 ^ uVar17) + 0x5a827999 +
           (uVar9 * 0x20 | uVar9 >> 0x1b);
  uVar18 = uVar15 * 0x40000000 | uVar15 >> 2;
  uVar16 = this->m_block->l[0xb];
  uVar16 = uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 | uVar16 << 0x18;
  this->m_block->l[0xb] = uVar16;
  uVar15 = uVar9 * 0x40000000 | uVar9 >> 2;
  uVar9 = uVar16 + uVar17 + ((uVar18 ^ uVar12) & uVar9 ^ uVar12) + 0x5a827999 +
          (uVar13 * 0x20 | uVar13 >> 0x1b);
  uVar16 = this->m_block->l[0xc];
  uVar16 = uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 | uVar16 << 0x18;
  this->m_block->l[0xc] = uVar16;
  uVar17 = uVar16 + uVar12 + ((uVar15 ^ uVar18) & uVar13 ^ uVar18) + 0x5a827999 +
           (uVar9 * 0x20 | uVar9 >> 0x1b);
  uVar13 = uVar13 * 0x40000000 | uVar13 >> 2;
  uVar16 = this->m_block->l[0xd];
  uVar16 = uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 | uVar16 << 0x18;
  this->m_block->l[0xd] = uVar16;
  uVar18 = uVar16 + uVar18 + ((uVar13 ^ uVar15) & uVar9 ^ uVar15) + 0x5a827999 +
           (uVar17 * 0x20 | uVar17 >> 0x1b);
  uVar12 = uVar9 * 0x40000000 | uVar9 >> 2;
  uVar16 = this->m_block->l[0xe];
  uVar16 = uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 | uVar16 << 0x18;
  this->m_block->l[0xe] = uVar16;
  uVar19 = uVar16 + uVar15 + ((uVar12 ^ uVar13) & uVar17 ^ uVar13) + 0x5a827999 +
           (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar9 = uVar17 * 0x40000000 | uVar17 >> 2;
  uVar16 = this->m_block->l[0xf];
  uVar16 = uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 | uVar16 << 0x18;
  this->m_block->l[0xf] = uVar16;
  uVar17 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar15 = uVar16 + uVar13 + ((uVar9 ^ uVar12) & uVar18 ^ uVar12) + 0x5a827999 +
           (uVar19 * 0x20 | uVar19 >> 0x1b);
  pSVar1 = this->m_block;
  uVar16 = pSVar1->l[8] ^ pSVar1->l[0xd] ^ pSVar1->l[2] ^ pSVar1->l[0];
  uVar16 = uVar16 << 1 | (uint)((int)uVar16 < 0);
  pSVar1->l[0] = uVar16;
  uVar20 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar16 = ((uVar17 ^ uVar9) & uVar19 ^ uVar9) + uVar12 + uVar16 + 0x5a827999 +
           (uVar15 * 0x20 | uVar15 >> 0x1b);
  pSVar1 = this->m_block;
  uVar12 = pSVar1->l[9] ^ pSVar1->l[0xe] ^ pSVar1->l[3] ^ pSVar1->l[1];
  uVar12 = uVar12 << 1 | (uint)((int)uVar12 < 0);
  pSVar1->l[1] = uVar12;
  uVar18 = uVar15 * 0x40000000 | uVar15 >> 2;
  uVar9 = ((uVar20 ^ uVar17) & uVar15 ^ uVar17) + uVar9 + uVar12 + 0x5a827999 +
          (uVar16 * 0x20 | uVar16 >> 0x1b);
  pSVar1 = this->m_block;
  uVar12 = pSVar1->l[10] ^ pSVar1->l[0xf] ^ pSVar1->l[4] ^ pSVar1->l[2];
  uVar15 = uVar12 << 1 | (uint)((int)uVar12 < 0);
  pSVar1->l[2] = uVar15;
  uVar12 = uVar16 * 0x40000000 | uVar16 >> 2;
  uVar13 = ((uVar18 ^ uVar20) & uVar16 ^ uVar20) + uVar17 + uVar15 + 0x5a827999 +
           (uVar9 * 0x20 | uVar9 >> 0x1b);
  pSVar1 = this->m_block;
  uVar16 = pSVar1->l[0xb] ^ pSVar1->l[0] ^ pSVar1->l[5] ^ pSVar1->l[3];
  uVar15 = uVar16 << 1 | (uint)((int)uVar16 < 0);
  pSVar1->l[3] = uVar15;
  uVar16 = uVar9 * 0x40000000 | uVar9 >> 2;
  uVar17 = ((uVar12 ^ uVar18) & uVar9 ^ uVar18) + uVar20 + uVar15 + 0x5a827999 +
           (uVar13 * 0x20 | uVar13 >> 0x1b);
  pSVar1 = this->m_block;
  uVar9 = pSVar1->l[0xc] ^ pSVar1->l[1] ^ pSVar1->l[6] ^ pSVar1->l[4];
  uVar9 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  pSVar1->l[4] = uVar9;
  uVar15 = uVar13 * 0x40000000 | uVar13 >> 2;
  uVar19 = (uVar16 ^ uVar12 ^ uVar13) + uVar18 + uVar9 + 0x6ed9eba1 +
           (uVar17 * 0x20 | uVar17 >> 0x1b);
  pSVar1 = this->m_block;
  uVar9 = pSVar1->l[0xd] ^ pSVar1->l[2] ^ pSVar1->l[7] ^ pSVar1->l[5];
  uVar9 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  pSVar1->l[5] = uVar9;
  uVar18 = (uVar15 ^ uVar16 ^ uVar17) + uVar12 + uVar9 + 0x6ed9eba1 +
           (uVar19 * 0x20 | uVar19 >> 0x1b);
  uVar13 = uVar17 * 0x40000000 | uVar17 >> 2;
  pSVar1 = this->m_block;
  uVar12 = pSVar1->l[0xe] ^ pSVar1->l[3] ^ pSVar1->l[8] ^ pSVar1->l[6];
  uVar12 = uVar12 << 1 | (uint)((int)uVar12 < 0);
  pSVar1->l[6] = uVar12;
  uVar16 = (uVar13 ^ uVar15 ^ uVar19) + uVar16 + uVar12 + 0x6ed9eba1 +
           (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar19 = uVar19 * 0x40000000 | uVar19 >> 2;
  pSVar1 = this->m_block;
  uVar12 = pSVar1->l[0xf] ^ pSVar1->l[4] ^ pSVar1->l[9] ^ pSVar1->l[7];
  uVar12 = uVar12 << 1 | (uint)((int)uVar12 < 0);
  pSVar1->l[7] = uVar12;
  uVar9 = (uVar19 ^ uVar13 ^ uVar18) + uVar15 + uVar12 + 0x6ed9eba1 +
          (uVar16 * 0x20 | uVar16 >> 0x1b);
  uVar17 = uVar18 * 0x40000000 | uVar18 >> 2;
  pSVar1 = this->m_block;
  uVar12 = pSVar1->l[0] ^ pSVar1->l[5] ^ pSVar1->l[10] ^ pSVar1->l[8];
  uVar15 = uVar12 << 1 | (uint)((int)uVar12 < 0);
  pSVar1->l[8] = uVar15;
  uVar12 = uVar16 * 0x40000000 | uVar16 >> 2;
  uVar16 = (uVar17 ^ uVar19 ^ uVar16) + uVar13 + uVar15 + 0x6ed9eba1 +
           (uVar9 * 0x20 | uVar9 >> 0x1b);
  pSVar1 = this->m_block;
  uVar15 = pSVar1->l[1] ^ pSVar1->l[6] ^ pSVar1->l[0xb] ^ pSVar1->l[9];
  uVar15 = uVar15 << 1 | (uint)((int)uVar15 < 0);
  pSVar1->l[9] = uVar15;
  uVar13 = (uVar12 ^ uVar17 ^ uVar9) + uVar19 + uVar15 + 0x6ed9eba1 +
           (uVar16 * 0x20 | uVar16 >> 0x1b);
  uVar15 = uVar9 * 0x40000000 | uVar9 >> 2;
  pSVar1 = this->m_block;
  uVar9 = pSVar1->l[2] ^ pSVar1->l[7] ^ pSVar1->l[0xc] ^ pSVar1->l[10];
  uVar9 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  pSVar1->l[10] = uVar9;
  uVar17 = (uVar15 ^ uVar12 ^ uVar16) + uVar17 + uVar9 + 0x6ed9eba1 +
           (uVar13 * 0x20 | uVar13 >> 0x1b);
  uVar9 = uVar16 * 0x40000000 | uVar16 >> 2;
  pSVar1 = this->m_block;
  uVar16 = pSVar1->l[3] ^ pSVar1->l[8] ^ pSVar1->l[0xd] ^ pSVar1->l[0xb];
  uVar16 = uVar16 << 1 | (uint)((int)uVar16 < 0);
  pSVar1->l[0xb] = uVar16;
  uVar19 = (uVar9 ^ uVar15 ^ uVar13) + uVar12 + uVar16 + 0x6ed9eba1 +
           (uVar17 * 0x20 | uVar17 >> 0x1b);
  uVar13 = uVar13 * 0x40000000 | uVar13 >> 2;
  pSVar1 = this->m_block;
  uVar16 = pSVar1->l[4] ^ pSVar1->l[9] ^ pSVar1->l[0xe] ^ pSVar1->l[0xc];
  uVar16 = uVar16 << 1 | (uint)((int)uVar16 < 0);
  pSVar1->l[0xc] = uVar16;
  uVar18 = uVar17 * 0x40000000 | uVar17 >> 2;
  uVar16 = (uVar13 ^ uVar9 ^ uVar17) + uVar15 + uVar16 + 0x6ed9eba1 +
           (uVar19 * 0x20 | uVar19 >> 0x1b);
  pSVar1 = this->m_block;
  uVar12 = pSVar1->l[5] ^ pSVar1->l[10] ^ pSVar1->l[0xf] ^ pSVar1->l[0xd];
  uVar12 = uVar12 << 1 | (uint)((int)uVar12 < 0);
  pSVar1->l[0xd] = uVar12;
  uVar17 = (uVar18 ^ uVar13 ^ uVar19) + uVar9 + uVar12 + 0x6ed9eba1 +
           (uVar16 * 0x20 | uVar16 >> 0x1b);
  uVar19 = uVar19 * 0x40000000 | uVar19 >> 2;
  pSVar1 = this->m_block;
  uVar12 = pSVar1->l[6] ^ pSVar1->l[0xb] ^ pSVar1->l[0] ^ pSVar1->l[0xe];
  uVar12 = uVar12 << 1 | (uint)((int)uVar12 < 0);
  pSVar1->l[0xe] = uVar12;
  uVar12 = (uVar19 ^ uVar18 ^ uVar16) + uVar13 + uVar12 + 0x6ed9eba1 +
           (uVar17 * 0x20 | uVar17 >> 0x1b);
  uVar16 = uVar16 * 0x40000000 | uVar16 >> 2;
  pSVar1 = this->m_block;
  uVar9 = pSVar1->l[7] ^ pSVar1->l[0xc] ^ pSVar1->l[1] ^ pSVar1->l[0xf];
  uVar9 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  pSVar1->l[0xf] = uVar9;
  uVar15 = (uVar16 ^ uVar19 ^ uVar17) + uVar18 + uVar9 + 0x6ed9eba1 +
           (uVar12 * 0x20 | uVar12 >> 0x1b);
  uVar17 = uVar17 * 0x40000000 | uVar17 >> 2;
  pSVar1 = this->m_block;
  uVar9 = pSVar1->l[8] ^ pSVar1->l[0xd] ^ pSVar1->l[2] ^ pSVar1->l[0];
  uVar13 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  pSVar1->l[0] = uVar13;
  uVar9 = uVar12 * 0x40000000 | uVar12 >> 2;
  uVar13 = (uVar17 ^ uVar16 ^ uVar12) + uVar19 + uVar13 + 0x6ed9eba1 +
           (uVar15 * 0x20 | uVar15 >> 0x1b);
  pSVar1 = this->m_block;
  uVar12 = pSVar1->l[9] ^ pSVar1->l[0xe] ^ pSVar1->l[3] ^ pSVar1->l[1];
  uVar12 = uVar12 << 1 | (uint)((int)uVar12 < 0);
  pSVar1->l[1] = uVar12;
  uVar18 = (uVar9 ^ uVar17 ^ uVar15) + uVar16 + uVar12 + 0x6ed9eba1 +
           (uVar13 * 0x20 | uVar13 >> 0x1b);
  uVar15 = uVar15 * 0x40000000 | uVar15 >> 2;
  pSVar1 = this->m_block;
  uVar16 = pSVar1->l[10] ^ pSVar1->l[0xf] ^ pSVar1->l[4] ^ pSVar1->l[2];
  uVar16 = uVar16 << 1 | (uint)((int)uVar16 < 0);
  pSVar1->l[2] = uVar16;
  uVar16 = (uVar15 ^ uVar9 ^ uVar13) + uVar17 + uVar16 + 0x6ed9eba1 +
           (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar13 = uVar13 * 0x40000000 | uVar13 >> 2;
  pSVar1 = this->m_block;
  uVar12 = pSVar1->l[0xb] ^ pSVar1->l[0] ^ pSVar1->l[5] ^ pSVar1->l[3];
  uVar12 = uVar12 << 1 | (uint)((int)uVar12 < 0);
  pSVar1->l[3] = uVar12;
  uVar17 = (uVar13 ^ uVar15 ^ uVar18) + uVar9 + uVar12 + 0x6ed9eba1 +
           (uVar16 * 0x20 | uVar16 >> 0x1b);
  uVar19 = uVar18 * 0x40000000 | uVar18 >> 2;
  pSVar1 = this->m_block;
  uVar12 = pSVar1->l[0xc] ^ pSVar1->l[1] ^ pSVar1->l[6] ^ pSVar1->l[4];
  uVar9 = uVar12 << 1 | (uint)((int)uVar12 < 0);
  pSVar1->l[4] = uVar9;
  uVar12 = uVar16 * 0x40000000 | uVar16 >> 2;
  uVar16 = (uVar19 ^ uVar13 ^ uVar16) + uVar15 + uVar9 + 0x6ed9eba1 +
           (uVar17 * 0x20 | uVar17 >> 0x1b);
  pSVar1 = this->m_block;
  uVar9 = pSVar1->l[0xd] ^ pSVar1->l[2] ^ pSVar1->l[7] ^ pSVar1->l[5];
  uVar9 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  pSVar1->l[5] = uVar9;
  uVar18 = (uVar12 ^ uVar19 ^ uVar17) + uVar13 + uVar9 + 0x6ed9eba1 +
           (uVar16 * 0x20 | uVar16 >> 0x1b);
  uVar13 = uVar17 * 0x40000000 | uVar17 >> 2;
  pSVar1 = this->m_block;
  uVar9 = pSVar1->l[0xe] ^ pSVar1->l[3] ^ pSVar1->l[8] ^ pSVar1->l[6];
  uVar9 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  pSVar1->l[6] = uVar9;
  uVar15 = (uVar13 ^ uVar12 ^ uVar16) + uVar19 + uVar9 + 0x6ed9eba1 +
           (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar9 = uVar16 * 0x40000000 | uVar16 >> 2;
  pSVar1 = this->m_block;
  uVar16 = pSVar1->l[0xf] ^ pSVar1->l[4] ^ pSVar1->l[9] ^ pSVar1->l[7];
  uVar16 = uVar16 << 1 | (uint)((int)uVar16 < 0);
  pSVar1->l[7] = uVar16;
  uVar19 = (uVar9 ^ uVar13 ^ uVar18) + uVar12 + uVar16 + 0x6ed9eba1 +
           (uVar15 * 0x20 | uVar15 >> 0x1b);
  uVar17 = uVar18 * 0x40000000 | uVar18 >> 2;
  pSVar1 = this->m_block;
  uVar16 = pSVar1->l[0] ^ pSVar1->l[5] ^ pSVar1->l[10] ^ pSVar1->l[8];
  uVar16 = uVar16 << 1 | (uint)((int)uVar16 < 0);
  pSVar1->l[8] = uVar16;
  iVar10 = (uVar15 & uVar17 | (uVar15 | uVar17) & uVar9) + uVar13 + uVar16 +
           (uVar19 * 0x20 | uVar19 >> 0x1b);
  uVar15 = uVar15 * 0x40000000 | uVar15 >> 2;
  uVar16 = iVar10 + 0x8f1bbcdc;
  pSVar1 = this->m_block;
  uVar12 = pSVar1->l[1] ^ pSVar1->l[6] ^ pSVar1->l[0xb] ^ pSVar1->l[9];
  uVar12 = uVar12 << 1 | (uint)((int)uVar12 < 0);
  pSVar1->l[9] = uVar12;
  uVar13 = (uVar19 & uVar15 | (uVar19 | uVar15) & uVar17) + uVar9 + uVar12 + -0x70e44324 +
           (uVar16 * 0x20 | uVar16 >> 0x1b);
  uVar18 = uVar19 * 0x40000000 | uVar19 >> 2;
  pSVar1 = this->m_block;
  uVar12 = pSVar1->l[2] ^ pSVar1->l[7] ^ pSVar1->l[0xc] ^ pSVar1->l[10];
  uVar12 = uVar12 << 1 | (uint)((int)uVar12 < 0);
  pSVar1->l[10] = uVar12;
  iVar11 = (uVar16 & uVar18 | (uVar16 | uVar18) & uVar15) + uVar17 + uVar12 +
           (uVar13 * 0x20 | uVar13 >> 0x1b);
  uVar16 = iVar10 * 0x40000000 | uVar16 >> 2;
  uVar12 = iVar11 + 0x8f1bbcdc;
  pSVar1 = this->m_block;
  uVar9 = pSVar1->l[3] ^ pSVar1->l[8] ^ pSVar1->l[0xd] ^ pSVar1->l[0xb];
  uVar9 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  pSVar1->l[0xb] = uVar9;
  uVar17 = (uVar13 & uVar16 | (uVar13 | uVar16) & uVar18) + uVar15 + uVar9 + -0x70e44324 +
           (uVar12 * 0x20 | uVar12 >> 0x1b);
  uVar13 = uVar13 * 0x40000000 | uVar13 >> 2;
  pSVar1 = this->m_block;
  uVar9 = pSVar1->l[4] ^ pSVar1->l[9] ^ pSVar1->l[0xe] ^ pSVar1->l[0xc];
  uVar9 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  pSVar1->l[0xc] = uVar9;
  iVar14 = (uVar12 & uVar13 | (uVar12 | uVar13) & uVar16) + uVar18 + uVar9 +
           (uVar17 * 0x20 | uVar17 >> 0x1b);
  uVar12 = iVar11 * 0x40000000 | uVar12 >> 2;
  uVar15 = iVar14 + 0x8f1bbcdc;
  pSVar1 = this->m_block;
  uVar9 = pSVar1->l[5] ^ pSVar1->l[10] ^ pSVar1->l[0xf] ^ pSVar1->l[0xd];
  uVar9 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  pSVar1->l[0xd] = uVar9;
  uVar18 = (uVar17 & uVar12 | (uVar17 | uVar12) & uVar13) + uVar16 + uVar9 + -0x70e44324 +
           (uVar15 * 0x20 | uVar15 >> 0x1b);
  uVar17 = uVar17 * 0x40000000 | uVar17 >> 2;
  pSVar1 = this->m_block;
  uVar16 = pSVar1->l[6] ^ pSVar1->l[0xb] ^ pSVar1->l[0] ^ pSVar1->l[0xe];
  uVar16 = uVar16 << 1 | (uint)((int)uVar16 < 0);
  pSVar1->l[0xe] = uVar16;
  iVar10 = (uVar15 & uVar17 | (uVar15 | uVar17) & uVar12) + uVar13 + uVar16 +
           (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar15 = iVar14 * 0x40000000 | uVar15 >> 2;
  uVar16 = iVar10 + 0x8f1bbcdc;
  pSVar1 = this->m_block;
  uVar9 = pSVar1->l[7] ^ pSVar1->l[0xc] ^ pSVar1->l[1] ^ pSVar1->l[0xf];
  uVar9 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  pSVar1->l[0xf] = uVar9;
  uVar13 = (uVar18 & uVar15 | (uVar18 | uVar15) & uVar17) + uVar12 + uVar9 + -0x70e44324 +
           (uVar16 * 0x20 | uVar16 >> 0x1b);
  uVar18 = uVar18 * 0x40000000 | uVar18 >> 2;
  pSVar1 = this->m_block;
  uVar12 = pSVar1->l[8] ^ pSVar1->l[0xd] ^ pSVar1->l[2] ^ pSVar1->l[0];
  uVar12 = uVar12 << 1 | (uint)((int)uVar12 < 0);
  pSVar1->l[0] = uVar12;
  iVar11 = (uVar16 & uVar18 | (uVar16 | uVar18) & uVar15) + uVar17 + uVar12 +
           (uVar13 * 0x20 | uVar13 >> 0x1b);
  uVar16 = iVar10 * 0x40000000 | uVar16 >> 2;
  uVar12 = iVar11 + 0x8f1bbcdc;
  pSVar1 = this->m_block;
  uVar9 = pSVar1->l[9] ^ pSVar1->l[0xe] ^ pSVar1->l[3] ^ pSVar1->l[1];
  uVar9 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  pSVar1->l[1] = uVar9;
  uVar17 = (uVar13 & uVar16 | (uVar13 | uVar16) & uVar18) + uVar15 + uVar9 + -0x70e44324 +
           (uVar12 * 0x20 | uVar12 >> 0x1b);
  uVar13 = uVar13 * 0x40000000 | uVar13 >> 2;
  pSVar1 = this->m_block;
  uVar9 = pSVar1->l[10] ^ pSVar1->l[0xf] ^ pSVar1->l[4] ^ pSVar1->l[2];
  uVar9 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  pSVar1->l[2] = uVar9;
  iVar14 = (uVar12 & uVar13 | (uVar12 | uVar13) & uVar16) + uVar18 + uVar9 +
           (uVar17 * 0x20 | uVar17 >> 0x1b);
  uVar12 = iVar11 * 0x40000000 | uVar12 >> 2;
  uVar15 = iVar14 + 0x8f1bbcdc;
  pSVar1 = this->m_block;
  uVar9 = pSVar1->l[0xb] ^ pSVar1->l[0] ^ pSVar1->l[5] ^ pSVar1->l[3];
  uVar9 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  pSVar1->l[3] = uVar9;
  uVar18 = (uVar17 & uVar12 | (uVar17 | uVar12) & uVar13) + uVar16 + uVar9 + -0x70e44324 +
           (uVar15 * 0x20 | uVar15 >> 0x1b);
  uVar17 = uVar17 * 0x40000000 | uVar17 >> 2;
  pSVar1 = this->m_block;
  uVar16 = pSVar1->l[0xc] ^ pSVar1->l[1] ^ pSVar1->l[6] ^ pSVar1->l[4];
  uVar16 = uVar16 << 1 | (uint)((int)uVar16 < 0);
  pSVar1->l[4] = uVar16;
  iVar10 = (uVar15 & uVar17 | (uVar15 | uVar17) & uVar12) + uVar13 + uVar16 +
           (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar15 = iVar14 * 0x40000000 | uVar15 >> 2;
  uVar16 = iVar10 + 0x8f1bbcdc;
  pSVar1 = this->m_block;
  uVar9 = pSVar1->l[0xd] ^ pSVar1->l[2] ^ pSVar1->l[7] ^ pSVar1->l[5];
  uVar9 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  pSVar1->l[5] = uVar9;
  uVar13 = (uVar18 & uVar15 | (uVar18 | uVar15) & uVar17) + uVar12 + uVar9 + -0x70e44324 +
           (uVar16 * 0x20 | uVar16 >> 0x1b);
  uVar18 = uVar18 * 0x40000000 | uVar18 >> 2;
  pSVar1 = this->m_block;
  uVar12 = pSVar1->l[0xe] ^ pSVar1->l[3] ^ pSVar1->l[8] ^ pSVar1->l[6];
  uVar12 = uVar12 << 1 | (uint)((int)uVar12 < 0);
  pSVar1->l[6] = uVar12;
  iVar11 = (uVar16 & uVar18 | (uVar16 | uVar18) & uVar15) + uVar17 + uVar12 +
           (uVar13 * 0x20 | uVar13 >> 0x1b);
  uVar16 = iVar10 * 0x40000000 | uVar16 >> 2;
  uVar12 = iVar11 + 0x8f1bbcdc;
  pSVar1 = this->m_block;
  uVar9 = pSVar1->l[0xf] ^ pSVar1->l[4] ^ pSVar1->l[9] ^ pSVar1->l[7];
  uVar9 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  pSVar1->l[7] = uVar9;
  uVar17 = (uVar13 & uVar16 | (uVar13 | uVar16) & uVar18) + uVar15 + uVar9 + -0x70e44324 +
           (uVar12 * 0x20 | uVar12 >> 0x1b);
  uVar13 = uVar13 * 0x40000000 | uVar13 >> 2;
  pSVar1 = this->m_block;
  uVar9 = pSVar1->l[0] ^ pSVar1->l[5] ^ pSVar1->l[10] ^ pSVar1->l[8];
  uVar9 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  pSVar1->l[8] = uVar9;
  iVar14 = (uVar12 & uVar13 | (uVar12 | uVar13) & uVar16) + uVar18 + uVar9 +
           (uVar17 * 0x20 | uVar17 >> 0x1b);
  uVar12 = iVar11 * 0x40000000 | uVar12 >> 2;
  uVar15 = iVar14 + 0x8f1bbcdc;
  pSVar1 = this->m_block;
  uVar9 = pSVar1->l[1] ^ pSVar1->l[6] ^ pSVar1->l[0xb] ^ pSVar1->l[9];
  uVar9 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  pSVar1->l[9] = uVar9;
  uVar18 = (uVar17 & uVar12 | (uVar17 | uVar12) & uVar13) + uVar16 + uVar9 + -0x70e44324 +
           (uVar15 * 0x20 | uVar15 >> 0x1b);
  uVar17 = uVar17 * 0x40000000 | uVar17 >> 2;
  pSVar1 = this->m_block;
  uVar16 = pSVar1->l[2] ^ pSVar1->l[7] ^ pSVar1->l[0xc] ^ pSVar1->l[10];
  uVar16 = uVar16 << 1 | (uint)((int)uVar16 < 0);
  pSVar1->l[10] = uVar16;
  iVar10 = (uVar15 & uVar17 | (uVar15 | uVar17) & uVar12) + uVar13 + uVar16 +
           (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar15 = iVar14 * 0x40000000 | uVar15 >> 2;
  uVar16 = iVar10 + 0x8f1bbcdc;
  pSVar1 = this->m_block;
  uVar9 = pSVar1->l[3] ^ pSVar1->l[8] ^ pSVar1->l[0xd] ^ pSVar1->l[0xb];
  uVar9 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  pSVar1->l[0xb] = uVar9;
  uVar13 = (uVar18 & uVar15 | (uVar18 | uVar15) & uVar17) + uVar12 + uVar9 + -0x70e44324 +
           (uVar16 * 0x20 | uVar16 >> 0x1b);
  uVar18 = uVar18 * 0x40000000 | uVar18 >> 2;
  pSVar1 = this->m_block;
  uVar12 = pSVar1->l[4] ^ pSVar1->l[9] ^ pSVar1->l[0xe] ^ pSVar1->l[0xc];
  uVar12 = uVar12 << 1 | (uint)((int)uVar12 < 0);
  pSVar1->l[0xc] = uVar12;
  uVar12 = (uVar18 ^ uVar15 ^ uVar16) + uVar17 + uVar12 + -0x359d3e2a +
           (uVar13 * 0x20 | uVar13 >> 0x1b);
  uVar16 = iVar10 * 0x40000000 | uVar16 >> 2;
  pSVar1 = this->m_block;
  uVar9 = pSVar1->l[5] ^ pSVar1->l[10] ^ pSVar1->l[0xf] ^ pSVar1->l[0xd];
  uVar9 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  pSVar1->l[0xd] = uVar9;
  uVar17 = (uVar16 ^ uVar18 ^ uVar13) + uVar15 + uVar9 + -0x359d3e2a +
           (uVar12 * 0x20 | uVar12 >> 0x1b);
  uVar13 = uVar13 * 0x40000000 | uVar13 >> 2;
  pSVar1 = this->m_block;
  uVar9 = pSVar1->l[6] ^ pSVar1->l[0xb] ^ pSVar1->l[0] ^ pSVar1->l[0xe];
  uVar15 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  pSVar1->l[0xe] = uVar15;
  uVar9 = uVar12 * 0x40000000 | uVar12 >> 2;
  uVar12 = (uVar13 ^ uVar16 ^ uVar12) + uVar18 + uVar15 + -0x359d3e2a +
           (uVar17 * 0x20 | uVar17 >> 0x1b);
  pSVar1 = this->m_block;
  uVar15 = pSVar1->l[7] ^ pSVar1->l[0xc] ^ pSVar1->l[1] ^ pSVar1->l[0xf];
  uVar15 = uVar15 << 1 | (uint)((int)uVar15 < 0);
  pSVar1->l[0xf] = uVar15;
  uVar15 = (uVar9 ^ uVar13 ^ uVar17) + uVar16 + uVar15 + -0x359d3e2a +
           (uVar12 * 0x20 | uVar12 >> 0x1b);
  uVar17 = uVar17 * 0x40000000 | uVar17 >> 2;
  pSVar1 = this->m_block;
  uVar16 = pSVar1->l[8] ^ pSVar1->l[0xd] ^ pSVar1->l[2] ^ pSVar1->l[0];
  uVar16 = uVar16 << 1 | (uint)((int)uVar16 < 0);
  pSVar1->l[0] = uVar16;
  uVar18 = (uVar17 ^ uVar9 ^ uVar12) + uVar13 + uVar16 + -0x359d3e2a +
           (uVar15 * 0x20 | uVar15 >> 0x1b);
  uVar12 = uVar12 * 0x40000000 | uVar12 >> 2;
  pSVar1 = this->m_block;
  uVar16 = pSVar1->l[9] ^ pSVar1->l[0xe] ^ pSVar1->l[3] ^ pSVar1->l[1];
  uVar16 = uVar16 << 1 | (uint)((int)uVar16 < 0);
  pSVar1->l[1] = uVar16;
  uVar13 = (uVar12 ^ uVar17 ^ uVar15) + uVar9 + uVar16 + -0x359d3e2a +
           (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar15 = uVar15 * 0x40000000 | uVar15 >> 2;
  pSVar1 = this->m_block;
  uVar16 = pSVar1->l[10] ^ pSVar1->l[0xf] ^ pSVar1->l[4] ^ pSVar1->l[2];
  uVar16 = uVar16 << 1 | (uint)((int)uVar16 < 0);
  pSVar1->l[2] = uVar16;
  uVar19 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar16 = (uVar15 ^ uVar12 ^ uVar18) + uVar17 + uVar16 + -0x359d3e2a +
           (uVar13 * 0x20 | uVar13 >> 0x1b);
  pSVar1 = this->m_block;
  uVar9 = pSVar1->l[0xb] ^ pSVar1->l[0] ^ pSVar1->l[5] ^ pSVar1->l[3];
  uVar9 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  pSVar1->l[3] = uVar9;
  uVar18 = (uVar19 ^ uVar15 ^ uVar13) + uVar12 + uVar9 + -0x359d3e2a +
           (uVar16 * 0x20 | uVar16 >> 0x1b);
  uVar17 = uVar13 * 0x40000000 | uVar13 >> 2;
  pSVar1 = this->m_block;
  uVar12 = pSVar1->l[0xc] ^ pSVar1->l[1] ^ pSVar1->l[6] ^ pSVar1->l[4];
  uVar12 = uVar12 << 1 | (uint)((int)uVar12 < 0);
  pSVar1->l[4] = uVar12;
  uVar12 = (uVar17 ^ uVar19 ^ uVar16) + uVar15 + uVar12 + -0x359d3e2a +
           (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar16 = uVar16 * 0x40000000 | uVar16 >> 2;
  pSVar1 = this->m_block;
  uVar9 = pSVar1->l[0xd] ^ pSVar1->l[2] ^ pSVar1->l[7] ^ pSVar1->l[5];
  uVar9 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  pSVar1->l[5] = uVar9;
  uVar15 = (uVar16 ^ uVar17 ^ uVar18) + uVar19 + uVar9 + -0x359d3e2a +
           (uVar12 * 0x20 | uVar12 >> 0x1b);
  uVar18 = uVar18 * 0x40000000 | uVar18 >> 2;
  pSVar1 = this->m_block;
  uVar9 = pSVar1->l[0xe] ^ pSVar1->l[3] ^ pSVar1->l[8] ^ pSVar1->l[6];
  uVar13 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  pSVar1->l[6] = uVar13;
  uVar9 = uVar12 * 0x40000000 | uVar12 >> 2;
  uVar13 = (uVar18 ^ uVar16 ^ uVar12) + uVar17 + uVar13 + -0x359d3e2a +
           (uVar15 * 0x20 | uVar15 >> 0x1b);
  pSVar1 = this->m_block;
  uVar12 = pSVar1->l[0xf] ^ pSVar1->l[4] ^ pSVar1->l[9] ^ pSVar1->l[7];
  uVar12 = uVar12 << 1 | (uint)((int)uVar12 < 0);
  pSVar1->l[7] = uVar12;
  uVar17 = (uVar9 ^ uVar18 ^ uVar15) + uVar16 + uVar12 + -0x359d3e2a +
           (uVar13 * 0x20 | uVar13 >> 0x1b);
  uVar16 = uVar15 * 0x40000000 | uVar15 >> 2;
  pSVar1 = this->m_block;
  uVar12 = pSVar1->l[0] ^ pSVar1->l[5] ^ pSVar1->l[10] ^ pSVar1->l[8];
  uVar12 = uVar12 << 1 | (uint)((int)uVar12 < 0);
  pSVar1->l[8] = uVar12;
  uVar18 = (uVar16 ^ uVar9 ^ uVar13) + uVar18 + uVar12 + -0x359d3e2a +
           (uVar17 * 0x20 | uVar17 >> 0x1b);
  uVar15 = uVar13 * 0x40000000 | uVar13 >> 2;
  pSVar1 = this->m_block;
  uVar12 = pSVar1->l[1] ^ pSVar1->l[6] ^ pSVar1->l[0xb] ^ pSVar1->l[9];
  uVar12 = uVar12 << 1 | (uint)((int)uVar12 < 0);
  pSVar1->l[9] = uVar12;
  uVar9 = (uVar15 ^ uVar16 ^ uVar17) + uVar9 + uVar12 + -0x359d3e2a +
          (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar13 = uVar17 * 0x40000000 | uVar17 >> 2;
  pSVar1 = this->m_block;
  uVar12 = pSVar1->l[2] ^ pSVar1->l[7] ^ pSVar1->l[0xc] ^ pSVar1->l[10];
  uVar12 = uVar12 << 1 | (uint)((int)uVar12 < 0);
  pSVar1->l[10] = uVar12;
  uVar17 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar16 = (uVar13 ^ uVar15 ^ uVar18) + uVar16 + uVar12 + -0x359d3e2a +
           (uVar9 * 0x20 | uVar9 >> 0x1b);
  pSVar1 = this->m_block;
  uVar12 = pSVar1->l[3] ^ pSVar1->l[8] ^ pSVar1->l[0xd] ^ pSVar1->l[0xb];
  uVar12 = uVar12 << 1 | (uint)((int)uVar12 < 0);
  pSVar1->l[0xb] = uVar12;
  uVar12 = (uVar17 ^ uVar13 ^ uVar9) + uVar15 + uVar12 + -0x359d3e2a +
           (uVar16 * 0x20 | uVar16 >> 0x1b);
  uVar18 = uVar9 * 0x40000000 | uVar9 >> 2;
  pSVar1 = this->m_block;
  uVar9 = pSVar1->l[4] ^ pSVar1->l[9] ^ pSVar1->l[0xe] ^ pSVar1->l[0xc];
  uVar9 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  pSVar1->l[0xc] = uVar9;
  uVar15 = (uVar18 ^ uVar17 ^ uVar16) + uVar13 + uVar9 + -0x359d3e2a +
           (uVar12 * 0x20 | uVar12 >> 0x1b);
  uVar16 = uVar16 * 0x40000000 | uVar16 >> 2;
  pSVar1 = this->m_block;
  uVar9 = pSVar1->l[5] ^ pSVar1->l[10] ^ pSVar1->l[0xf] ^ pSVar1->l[0xd];
  uVar9 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  pSVar1->l[0xd] = uVar9;
  uVar17 = (uVar16 ^ uVar18 ^ uVar12) + uVar17 + uVar9 + -0x359d3e2a +
           (uVar15 * 0x20 | uVar15 >> 0x1b);
  uVar12 = uVar12 * 0x40000000 | uVar12 >> 2;
  pSVar1 = this->m_block;
  uVar9 = pSVar1->l[6] ^ pSVar1->l[0xb] ^ pSVar1->l[0] ^ pSVar1->l[0xe];
  uVar9 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  pSVar1->l[0xe] = uVar9;
  uVar13 = uVar15 * 0x40000000 | uVar15 >> 2;
  uVar15 = (uVar12 ^ uVar16 ^ uVar15) + uVar18 + uVar9 + -0x359d3e2a +
           (uVar17 * 0x20 | uVar17 >> 0x1b);
  pSVar1 = this->m_block;
  uVar9 = pSVar1->l[7] ^ pSVar1->l[0xc] ^ pSVar1->l[1] ^ pSVar1->l[0xf];
  uVar9 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  pSVar1->l[0xf] = uVar9;
  *state = (uVar13 ^ uVar12 ^ uVar17) + uVar16 + uVar9 + -0x359d3e2a +
           (uVar15 * 0x20 | uVar15 >> 0x1b) + *state;
  state[1] = uVar15 + state[1];
  state[2] = (uVar17 * 0x40000000 | uVar17 >> 2) + state[2];
  state[3] = uVar13 + state[3];
  state[4] = state[4] + uVar12;
  return;
}

Assistant:

void CSHA1::Transform(UINT_32 *state, UINT_8 *buffer)
{
	// Copy state[] to working vars
	UINT_32 a = state[0], b = state[1], c = state[2], d = state[3], e = state[4];

	memcpy(m_block, buffer, 64);

	// 4 rounds of 20 operations each. Loop unrolled.
	_R0(a,b,c,d,e, 0); _R0(e,a,b,c,d, 1); _R0(d,e,a,b,c, 2); _R0(c,d,e,a,b, 3);
	_R0(b,c,d,e,a, 4); _R0(a,b,c,d,e, 5); _R0(e,a,b,c,d, 6); _R0(d,e,a,b,c, 7);
	_R0(c,d,e,a,b, 8); _R0(b,c,d,e,a, 9); _R0(a,b,c,d,e,10); _R0(e,a,b,c,d,11);
	_R0(d,e,a,b,c,12); _R0(c,d,e,a,b,13); _R0(b,c,d,e,a,14); _R0(a,b,c,d,e,15);
	_R1(e,a,b,c,d,16); _R1(d,e,a,b,c,17); _R1(c,d,e,a,b,18); _R1(b,c,d,e,a,19);
	_R2(a,b,c,d,e,20); _R2(e,a,b,c,d,21); _R2(d,e,a,b,c,22); _R2(c,d,e,a,b,23);
	_R2(b,c,d,e,a,24); _R2(a,b,c,d,e,25); _R2(e,a,b,c,d,26); _R2(d,e,a,b,c,27);
	_R2(c,d,e,a,b,28); _R2(b,c,d,e,a,29); _R2(a,b,c,d,e,30); _R2(e,a,b,c,d,31);
	_R2(d,e,a,b,c,32); _R2(c,d,e,a,b,33); _R2(b,c,d,e,a,34); _R2(a,b,c,d,e,35);
	_R2(e,a,b,c,d,36); _R2(d,e,a,b,c,37); _R2(c,d,e,a,b,38); _R2(b,c,d,e,a,39);
	_R3(a,b,c,d,e,40); _R3(e,a,b,c,d,41); _R3(d,e,a,b,c,42); _R3(c,d,e,a,b,43);
	_R3(b,c,d,e,a,44); _R3(a,b,c,d,e,45); _R3(e,a,b,c,d,46); _R3(d,e,a,b,c,47);
	_R3(c,d,e,a,b,48); _R3(b,c,d,e,a,49); _R3(a,b,c,d,e,50); _R3(e,a,b,c,d,51);
	_R3(d,e,a,b,c,52); _R3(c,d,e,a,b,53); _R3(b,c,d,e,a,54); _R3(a,b,c,d,e,55);
	_R3(e,a,b,c,d,56); _R3(d,e,a,b,c,57); _R3(c,d,e,a,b,58); _R3(b,c,d,e,a,59);
	_R4(a,b,c,d,e,60); _R4(e,a,b,c,d,61); _R4(d,e,a,b,c,62); _R4(c,d,e,a,b,63);
	_R4(b,c,d,e,a,64); _R4(a,b,c,d,e,65); _R4(e,a,b,c,d,66); _R4(d,e,a,b,c,67);
	_R4(c,d,e,a,b,68); _R4(b,c,d,e,a,69); _R4(a,b,c,d,e,70); _R4(e,a,b,c,d,71);
	_R4(d,e,a,b,c,72); _R4(c,d,e,a,b,73); _R4(b,c,d,e,a,74); _R4(a,b,c,d,e,75);
	_R4(e,a,b,c,d,76); _R4(d,e,a,b,c,77); _R4(c,d,e,a,b,78); _R4(b,c,d,e,a,79);

	// Add the working vars back into state
	state[0] += a;
	state[1] += b;
	state[2] += c;
	state[3] += d;
	state[4] += e;

	// Wipe variables
#ifdef SHA1_WIPE_VARIABLES
	a = b = c = d = e = 0;
#endif
}